

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
BitsToBytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
           vector<bool,_std::allocator<bool>_> *bits)

{
  byte *pbVar1;
  const_reference cVar2;
  uint uVar3;
  long in_FS_OFFSET;
  allocator_type local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (long)(bits->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p +
             (((ulong)(bits->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset + 7 >> 3
              ) - (long)(bits->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) &
             0x1fffffffffffffff,&local_21);
  uVar3 = 0;
  while( true ) {
    if ((ulong)(bits->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_offset +
        ((long)(bits->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_p -
        (long)(bits->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p) * 8 <= (ulong)uVar3) break;
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](bits,(ulong)uVar3);
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + (uVar3 >> 3);
    *pbVar1 = *pbVar1 | cVar2 << ((byte)uVar3 & 7);
    uVar3 = uVar3 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> BitsToBytes(const std::vector<bool>& bits)
{
    std::vector<unsigned char> ret((bits.size() + 7) / 8);
    for (unsigned int p = 0; p < bits.size(); p++) {
        ret[p / 8] |= bits[p] << (p % 8);
    }
    return ret;
}